

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O0

int WriteWebPWithMetadata
              (FILE *out,WebPPicture *picture,WebPMemoryWriter *memory_writer,Metadata *metadata,
              int keep_metadata,int *metadata_written)

{
  void *__ptr;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  long lVar8;
  FILE *out_00;
  MetadataPayload *in_RCX;
  undefined8 *in_RDX;
  FILE *in_RDI;
  uint in_R8D;
  uint *in_R9;
  bool bVar9;
  bool bVar10;
  int is_lossless;
  int ok;
  uint32_t riff_size;
  int has_vp8x;
  int kVP8XChunkSize;
  size_t webp_size;
  uint8_t *webp;
  int write_xmp;
  int write_iccp;
  int write_exif;
  uint64_t metadata_size;
  uint32_t flags;
  size_t kMinSize;
  size_t kMaxChunkPayload;
  size_t kRiffHeaderSize;
  int kXMPFlag;
  int kICCPFlag;
  int kEXIFFlag;
  int kAlphaFlag;
  char kVP8XHeader [9];
  uint32_t in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff41;
  undefined1 in_stack_ffffffffffffff42;
  undefined1 in_stack_ffffffffffffff43;
  undefined1 in_stack_ffffffffffffff44;
  undefined1 in_stack_ffffffffffffff45;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  undefined1 uVar11;
  bool local_b7;
  uint uVar12;
  undefined4 uVar13;
  ulong __size;
  int *local_98;
  uint64_t local_80;
  uint32_t local_74 [8];
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined8 local_41;
  undefined1 local_39;
  uint *local_38;
  uint local_2c;
  MetadataPayload *local_28;
  undefined8 *local_20;
  FILE *local_10;
  uint local_4;
  
  local_41 = 0xa58385056;
  local_39 = 0;
  local_48 = 0x10;
  local_4c = 8;
  local_50 = 0x20;
  local_54 = 4;
  local_74[5] = 0xc;
  local_74[6] = 0;
  local_74[3] = 0xfffffff6;
  local_74[4] = 0xffffffff;
  local_74[1] = 0x14;
  local_74[2] = 0;
  local_74[0] = 0;
  local_80 = 0;
  local_38 = in_R9;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  iVar1 = UpdateFlagsAndSize(in_RCX,(uint)((in_R8D & 1) != 0),8,local_74,&local_80);
  iVar2 = UpdateFlagsAndSize(local_28 + 1,(uint)((local_2c & 2) != 0),0x20,local_74,&local_80);
  iVar3 = UpdateFlagsAndSize(local_28 + 2,(uint)((local_2c & 4) != 0),4,local_74,&local_80);
  __ptr = (void *)*local_20;
  __size = local_20[1];
  *local_38 = 0;
  if (__size < 0x14) {
    local_4 = 0;
  }
  else if ((__size - 8) + local_80 < 0xfffffffffffffff7) {
    if (local_80 == 0) {
      sVar7 = fwrite(__ptr,__size,1,local_10);
      local_4 = (uint)(sVar7 == 1);
    }
    else {
      uVar13 = 0x12;
      uVar4 = (uint)((*(int *)((long)__ptr + 0xc) != 0x58385056 ^ 0xffU) & 1);
      iVar5 = 0x12;
      if (uVar4 != 0) {
        iVar5 = 0;
      }
      iVar5 = (int)__size + -8 + iVar5 + (int)local_80;
      sVar7 = fwrite(__ptr,4,1,local_10);
      bVar9 = false;
      if (sVar7 == 1) {
        iVar6 = WriteLE32((FILE *)CONCAT17(in_stack_ffffffffffffff47,
                                           CONCAT16(in_stack_ffffffffffffff46,
                                                    CONCAT15(in_stack_ffffffffffffff45,
                                                             CONCAT14(in_stack_ffffffffffffff44,
                                                                      CONCAT13(
                                                  in_stack_ffffffffffffff43,
                                                  CONCAT12(in_stack_ffffffffffffff42,
                                                           CONCAT11(in_stack_ffffffffffffff41,
                                                                    in_stack_ffffffffffffff40)))))))
                          ,in_stack_ffffffffffffff3c);
        bVar9 = iVar6 != 0;
      }
      lVar8 = __size - 8;
      bVar10 = false;
      if (bVar9) {
        sVar7 = fwrite((void *)((long)__ptr + 8),4,1,local_10);
        bVar10 = sVar7 == 1;
      }
      local_98 = (int *)((long)__ptr + 0xc);
      out_00 = (FILE *)(lVar8 + -4);
      if (uVar4 == 0) {
        if ((*local_98 == 0x4c385056) && ((*(byte *)((long)__ptr + 0x18) & 0x10) != 0)) {
          local_74[0] = local_74[0] | 0x10;
        }
        bVar9 = false;
        if (bVar10) {
          sVar7 = fwrite(&local_41,8,1,local_10);
          bVar9 = sVar7 == 1;
        }
        uVar11 = false;
        if (bVar9) {
          iVar6 = WriteLE32((FILE *)(ulong)CONCAT16(in_stack_ffffffffffffff46,
                                                    CONCAT15(in_stack_ffffffffffffff45,
                                                             CONCAT14(in_stack_ffffffffffffff44,
                                                                      CONCAT13(
                                                  in_stack_ffffffffffffff43,
                                                  CONCAT12(in_stack_ffffffffffffff42,
                                                           CONCAT11(in_stack_ffffffffffffff41,
                                                                    in_stack_ffffffffffffff40)))))),
                            in_stack_ffffffffffffff3c);
          uVar11 = iVar6 != 0;
        }
        bVar9 = false;
        if ((bool)uVar11 != false) {
          iVar6 = WriteLE24((FILE *)CONCAT17(uVar11,(uint7)CONCAT15(in_stack_ffffffffffffff45,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff44,
                                                  CONCAT13(in_stack_ffffffffffffff43,
                                                           CONCAT12(in_stack_ffffffffffffff42,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff41,
                                                  in_stack_ffffffffffffff40)))))),
                            in_stack_ffffffffffffff3c);
          bVar9 = iVar6 != 0;
        }
        local_b7 = false;
        if (bVar9 != false) {
          iVar6 = WriteLE24((FILE *)CONCAT17(uVar11,CONCAT16(bVar9,(uint6)CONCAT14(
                                                  in_stack_ffffffffffffff44,
                                                  CONCAT13(in_stack_ffffffffffffff43,
                                                           CONCAT12(in_stack_ffffffffffffff42,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff41,
                                                  in_stack_ffffffffffffff40)))))),
                            in_stack_ffffffffffffff3c);
          local_b7 = iVar6 != 0;
        }
      }
      else {
        *(byte *)((long)__ptr + 0x14) = *(byte *)((long)__ptr + 0x14) | (byte)local_74[0];
        local_b7 = false;
        if (bVar10) {
          sVar7 = fwrite(local_98,0x12,1,local_10);
          local_b7 = sVar7 == 1;
        }
        local_98 = (int *)((long)__ptr + 0x1e);
        out_00 = (FILE *)(out_00[-1]._unused2 + 2);
      }
      uVar12 = (uint)local_b7;
      if (iVar2 != 0) {
        bVar9 = false;
        if (uVar12 != 0) {
          iVar2 = WriteMetadataChunk(out_00,(char *)CONCAT44(uVar13,uVar4),
                                     (MetadataPayload *)CONCAT44(iVar5,uVar12));
          bVar9 = iVar2 != 0;
        }
        uVar12 = (uint)bVar9;
        *local_38 = *local_38 | 2;
      }
      bVar9 = false;
      if (uVar12 != 0) {
        sVar7 = fwrite(local_98,(size_t)out_00,1,local_10);
        bVar9 = sVar7 == 1;
      }
      local_4 = (uint)bVar9;
      if (iVar1 != 0) {
        bVar9 = false;
        if (local_4 != 0) {
          iVar1 = WriteMetadataChunk(out_00,(char *)CONCAT44(uVar13,uVar4),
                                     (MetadataPayload *)CONCAT44(iVar5,local_4));
          bVar9 = iVar1 != 0;
        }
        local_4 = (uint)bVar9;
        *local_38 = *local_38 | 1;
      }
      if (iVar3 != 0) {
        bVar9 = false;
        if (local_4 != 0) {
          iVar1 = WriteMetadataChunk(out_00,(char *)CONCAT44(uVar13,uVar4),
                                     (MetadataPayload *)CONCAT44(iVar5,local_4));
          bVar9 = iVar1 != 0;
        }
        local_4 = (uint)bVar9;
        *local_38 = *local_38 | 4;
      }
    }
  }
  else {
    fprintf(stderr,"Error! Addition of metadata would exceed container size limit.\n");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int WriteWebPWithMetadata(FILE* const out,
                                 const WebPPicture* const picture,
                                 const WebPMemoryWriter* const memory_writer,
                                 const Metadata* const metadata,
                                 int keep_metadata,
                                 int* const metadata_written) {
  const char kVP8XHeader[] = "VP8X\x0a\x00\x00\x00";
  const int kAlphaFlag = 0x10;
  const int kEXIFFlag  = 0x08;
  const int kICCPFlag  = 0x20;
  const int kXMPFlag   = 0x04;
  const size_t kRiffHeaderSize = 12;
  const size_t kMaxChunkPayload = ~0 - kChunkHeaderSize - 1;
  const size_t kMinSize = kRiffHeaderSize + kChunkHeaderSize;
  uint32_t flags = 0;
  uint64_t metadata_size = 0;
  const int write_exif = UpdateFlagsAndSize(&metadata->exif,
                                            !!(keep_metadata & METADATA_EXIF),
                                            kEXIFFlag, &flags, &metadata_size);
  const int write_iccp = UpdateFlagsAndSize(&metadata->iccp,
                                            !!(keep_metadata & METADATA_ICC),
                                            kICCPFlag, &flags, &metadata_size);
  const int write_xmp  = UpdateFlagsAndSize(&metadata->xmp,
                                            !!(keep_metadata & METADATA_XMP),
                                            kXMPFlag, &flags, &metadata_size);
  uint8_t* webp = memory_writer->mem;
  size_t webp_size = memory_writer->size;

  *metadata_written = 0;

  if (webp_size < kMinSize) return 0;
  if (webp_size - kChunkHeaderSize + metadata_size > kMaxChunkPayload) {
    fprintf(stderr, "Error! Addition of metadata would exceed "
                    "container size limit.\n");
    return 0;
  }

  if (metadata_size > 0) {
    const int kVP8XChunkSize = 18;
    const int has_vp8x = !memcmp(webp + kRiffHeaderSize, "VP8X", kTagSize);
    const uint32_t riff_size = (uint32_t)(webp_size - kChunkHeaderSize +
                                          (has_vp8x ? 0 : kVP8XChunkSize) +
                                          metadata_size);
    // RIFF
    int ok = (fwrite(webp, kTagSize, 1, out) == 1);
    // RIFF size (file header size is not recorded)
    ok = ok && WriteLE32(out, riff_size);
    webp += kChunkHeaderSize;
    webp_size -= kChunkHeaderSize;
    // WEBP
    ok = ok && (fwrite(webp, kTagSize, 1, out) == 1);
    webp += kTagSize;
    webp_size -= kTagSize;
    if (has_vp8x) {  // update the existing VP8X flags
      webp[kChunkHeaderSize] |= (uint8_t)(flags & 0xff);
      ok = ok && (fwrite(webp, kVP8XChunkSize, 1, out) == 1);
      webp += kVP8XChunkSize;
      webp_size -= kVP8XChunkSize;
    } else {
      const int is_lossless = !memcmp(webp, "VP8L", kTagSize);
      if (is_lossless) {
        // Presence of alpha is stored in the 37th bit (29th after the
        // signature) of VP8L data.
        if (webp[kChunkHeaderSize + 4] & (1 << 4)) flags |= kAlphaFlag;
      }
      ok = ok && (fwrite(kVP8XHeader, kChunkHeaderSize, 1, out) == 1);
      ok = ok && WriteLE32(out, flags);
      ok = ok && WriteLE24(out, picture->width - 1);
      ok = ok && WriteLE24(out, picture->height - 1);
    }
    if (write_iccp) {
      ok = ok && WriteMetadataChunk(out, "ICCP", &metadata->iccp);
      *metadata_written |= METADATA_ICC;
    }
    // Image
    ok = ok && (fwrite(webp, webp_size, 1, out) == 1);
    if (write_exif) {
      ok = ok && WriteMetadataChunk(out, "EXIF", &metadata->exif);
      *metadata_written |= METADATA_EXIF;
    }
    if (write_xmp) {
      ok = ok && WriteMetadataChunk(out, "XMP ", &metadata->xmp);
      *metadata_written |= METADATA_XMP;
    }
    return ok;
  }

  // No metadata, just write the original image file.
  return (fwrite(webp, webp_size, 1, out) == 1);
}